

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

QVariant * __thiscall QGraphicsView::inputMethodQuery(QGraphicsView *this,InputMethodQuery query)

{
  bool bVar1;
  int iVar2;
  QGraphicsViewPrivate *pQVar3;
  QGraphicsScene *pQVar4;
  QPoint QVar5;
  undefined4 in_EDX;
  QVariant *in_RDI;
  long in_FS_OFFSET;
  QRect QVar6;
  QGraphicsViewPrivate *d;
  QVariant *value;
  QPoint *in_stack_fffffffffffffe28;
  QPointF *in_stack_fffffffffffffe30;
  QRect *in_stack_fffffffffffffe38;
  QRectF *in_stack_fffffffffffffe40;
  QGraphicsViewPrivate *in_stack_fffffffffffffe48;
  QGraphicsView *in_stack_fffffffffffffe50;
  QRectF *in_stack_fffffffffffffe58;
  QRect *local_17c;
  QVariant *local_a0;
  QVariant *local_98;
  QVariant local_88;
  QVariant local_68;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QGraphicsView *)0xa3b2f2);
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QGraphicsScene> *)0xa3b308);
  if (bVar1) {
    (in_RDI->d).data.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)((long)&(in_RDI->d).data + 8) = &DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)((long)&(in_RDI->d).data + 0x10) = &DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)&(in_RDI->d).field_0x18 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar4 = QPointer<QGraphicsScene>::operator->((QPointer<QGraphicsScene> *)0xa3b361);
    (**(code **)(*(long *)pQVar4 + 0x60))(in_RDI,pQVar4,in_EDX);
    iVar2 = ::QVariant::userType((QVariant *)0xa3b380);
    if (iVar2 == 0x14) {
      ::QVariant::toRectF();
      QGraphicsViewPrivate::mapRectFromScene(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
      ::QVariant::QVariant(&local_28,(QRectF *)pQVar3);
      ::QVariant::operator=(local_98,local_a0);
      ::QVariant::~QVariant(&local_28);
    }
    else {
      iVar2 = ::QVariant::userType((QVariant *)0xa3b424);
      if (iVar2 == 0x1a) {
        ::QVariant::toPointF();
        QVar5 = mapFromScene(in_stack_fffffffffffffe50,(QPointF *)in_stack_fffffffffffffe48);
        ::QVariant::QVariant(&local_48,(QPoint *)QVar5);
        ::QVariant::operator=
                  ((QVariant *)in_stack_fffffffffffffe38,(QVariant *)in_stack_fffffffffffffe30);
        ::QVariant::~QVariant(&local_48);
      }
      else {
        iVar2 = ::QVariant::userType((QVariant *)0xa3b49c);
        if (iVar2 == 0x13) {
          ::QVariant::toRect();
          QRectF::QRectF(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
          QGraphicsViewPrivate::mapRectFromScene
                    (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
          QVar6 = QRectF::toRect(in_stack_fffffffffffffe58);
          local_17c = QVar6._0_8_;
          ::QVariant::QVariant(&local_68,local_17c);
          ::QVariant::operator=
                    ((QVariant *)in_stack_fffffffffffffe38,(QVariant *)in_stack_fffffffffffffe30);
          ::QVariant::~QVariant(&local_68);
        }
        else {
          iVar2 = ::QVariant::userType((QVariant *)0xa3b554);
          if (iVar2 == 0x19) {
            ::QVariant::toPoint();
            QPointF::QPointF(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
            QVar5 = mapFromScene(in_stack_fffffffffffffe50,(QPointF *)in_stack_fffffffffffffe48);
            ::QVariant::QVariant(&local_88,(QPoint *)QVar5);
            ::QVariant::operator=
                      ((QVariant *)in_stack_fffffffffffffe38,(QVariant *)in_stack_fffffffffffffe30);
            ::QVariant::~QVariant(&local_88);
          }
        }
      }
    }
  }
  else {
    ::QVariant::QVariant((QVariant *)0xa3b316);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QGraphicsView::inputMethodQuery(Qt::InputMethodQuery query) const
{
    Q_D(const QGraphicsView);
    if (!d->scene)
        return QVariant();

    QVariant value = d->scene->inputMethodQuery(query);
    if (value.userType() == QMetaType::QRectF)
        value = d->mapRectFromScene(value.toRectF());
    else if (value.userType() == QMetaType::QPointF)
        value = mapFromScene(value.toPointF());
    else if (value.userType() == QMetaType::QRect)
        value = d->mapRectFromScene(value.toRect()).toRect();
    else if (value.userType() == QMetaType::QPoint)
        value = mapFromScene(value.toPoint());
    return value;
}